

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adig.c
# Opt level: O3

void print_record(ares_dns_record_t *dnsrec)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  undefined4 uVar4;
  uint uVar5;
  int iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ares_dns_rr_t *paVar12;
  long lVar13;
  size_t sVar14;
  char *pcVar15;
  uchar *cookie;
  size_t cookie_len;
  char *local_48;
  ulong local_40;
  undefined4 local_34;
  
  if (global_config.opts.display_comments != ARES_FALSE) {
    uVar4 = ares_dns_record_get_opcode(dnsrec);
    uVar7 = ares_dns_opcode_tostr(uVar4);
    uVar4 = ares_dns_record_get_rcode(dnsrec);
    uVar8 = ares_dns_rcode_tostr(uVar4);
    uVar2 = ares_dns_record_get_id(dnsrec);
    printf(";; ->>HEADER<<- opcode: %s, status: %s, id: %u\n",uVar7,uVar8,(ulong)uVar2);
    printf(";; flags:");
    uVar2 = ares_dns_record_get_flags(dnsrec);
    if ((uVar2 & 1) != 0) {
      printf(" qr");
    }
    if ((uVar2 & 2) != 0) {
      printf(" aa");
    }
    if ((uVar2 & 4) != 0) {
      printf(" tc");
    }
    if ((uVar2 & 8) != 0) {
      printf(" rd");
    }
    if ((uVar2 & 0x10) != 0) {
      printf(" ra");
    }
    if ((uVar2 & 0x20) != 0) {
      printf(" ad");
    }
    if ((uVar2 & 0x40) != 0) {
      printf(" cd");
    }
    uVar9 = ares_dns_record_query_cnt(dnsrec);
    uVar10 = ares_dns_record_rr_cnt(dnsrec,1);
    uVar11 = ares_dns_record_rr_cnt(dnsrec,2);
    uVar5 = ares_dns_record_rr_cnt(dnsrec,3);
    printf("; QUERY: %u, ANSWER: %u, AUTHORITY: %u, ADDITIONAL: %u\n\n",uVar9 & 0xffffffff,
           uVar10 & 0xffffffff,uVar11 & 0xffffffff,(ulong)uVar5);
    paVar12 = has_opt(dnsrec,ARES_SECTION_ADDITIONAL);
    local_48 = (char *)0x0;
    local_40 = 0;
    if (paVar12 != (ares_dns_rr_t *)0x0) {
      iVar6 = ares_dns_rr_get_opt_byid(paVar12,0x1009,10,&local_48,&local_40);
      if (iVar6 == 0) {
        local_48 = (char *)0x0;
      }
      puts(";; OPT PSEUDOSECTION:");
      bVar1 = ares_dns_rr_get_u8(paVar12,0x1007);
      uVar2 = ares_dns_rr_get_u16(paVar12,0x1008);
      uVar3 = ares_dns_rr_get_u16(paVar12,0x1005);
      printf("; EDNS: version: %u, flags: %u; udp: %u\n",(ulong)bVar1,(ulong)uVar2,(ulong)uVar3);
      if (local_48 != (char *)0x0) {
        printf("; COOKIE: ");
        uVar9 = local_40;
        pcVar15 = local_48;
        if (local_40 != 0) {
          uVar10 = 0;
          do {
            printf("%02x",(ulong)(byte)pcVar15[uVar10]);
            uVar10 = uVar10 + 1;
          } while (uVar9 != uVar10);
        }
        puts(" (good)");
      }
    }
  }
  if (global_config.opts.display_question != ARES_FALSE) {
    if (global_config.opts.display_comments != ARES_FALSE) {
      puts(";; QUESTION SECTION:");
    }
    lVar13 = ares_dns_record_query_cnt(dnsrec);
    if (lVar13 != 0) {
      uVar9 = 0;
      do {
        iVar6 = ares_dns_record_query_get(dnsrec,uVar9,&local_48,&local_40,&local_34);
        pcVar15 = local_48;
        if ((iVar6 != 0) || (local_48 == (char *)0x0)) goto LAB_00104852;
        sVar14 = strlen(local_48);
        printf(";%s.\t",pcVar15);
        if (sVar14 + 1 < 0x18) {
          putchar(9);
          if (sVar14 + 1 < 0x10) {
            putchar(9);
          }
        }
        if (global_config.opts.display_class != ARES_FALSE) {
          uVar7 = ares_dns_class_tostr(local_34);
          printf("%s\t",uVar7);
        }
        pcVar15 = (char *)ares_dns_rec_type_tostr(local_40 & 0xffffffff);
        puts(pcVar15);
        uVar9 = uVar9 + 1;
        uVar10 = ares_dns_record_query_cnt(dnsrec);
      } while (uVar9 < uVar10);
    }
    if (global_config.opts.display_comments != ARES_FALSE) {
      putchar(10);
    }
  }
LAB_00104852:
  if (global_config.opts.display_answer != ARES_FALSE) {
    print_section(dnsrec,ARES_SECTION_ANSWER);
  }
  if (global_config.opts.display_additional != ARES_FALSE) {
    print_section(dnsrec,ARES_SECTION_ADDITIONAL);
  }
  if (global_config.opts.display_authority != ARES_FALSE) {
    print_section(dnsrec,ARES_SECTION_AUTHORITY);
  }
  if (global_config.opts.display_stats != ARES_FALSE) {
    local_48 = (char *)0x0;
    local_40 = 0;
    ares_dns_write(dnsrec,&local_48,&local_40);
    printf(";; MSG SIZE  rcvd: %d\n\n",local_40 & 0xffffffff);
    ares_free_string(local_48);
  }
  return;
}

Assistant:

static void print_record(const ares_dns_record_t *dnsrec)
{
  if (global_config.opts.display_comments) {
    print_header(dnsrec);
    print_opt_psuedosection(dnsrec);
  }

  if (global_config.opts.display_question) {
    print_question(dnsrec);
  }

  if (global_config.opts.display_answer) {
    print_section(dnsrec, ARES_SECTION_ANSWER);
  }

  if (global_config.opts.display_additional) {
    print_section(dnsrec, ARES_SECTION_ADDITIONAL);
  }

  if (global_config.opts.display_authority) {
    print_section(dnsrec, ARES_SECTION_AUTHORITY);
  }

  if (global_config.opts.display_stats) {
    unsigned char *abuf = NULL;
    size_t         alen = 0;
    ares_dns_write(dnsrec, &abuf, &alen);
    printf(";; MSG SIZE  rcvd: %d\n\n", (int)alen);
    ares_free_string(abuf);
  }
}